

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall
Centaurus::ATNNode<unsigned_char>::ATNNode(ATNNode<unsigned_char> *this,ATNNode<unsigned_char> *old)

{
  pointer pAVar1;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001b2800;
  pAVar1 = (old->m_transitions).
           super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
  (this->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (old->m_transitions).
       super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (old->m_transitions).
  super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_type = old->m_type;
  Identifier::Identifier(&this->m_invoke,&old->m_invoke);
  NFA<unsigned_char>::NFA(&this->m_nfa,&old->m_nfa);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string(&this->m_literal,&old->m_literal);
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(ATNNode<TCHAR>&& old)
        : m_transitions(std::move(old.m_transitions)), m_type(old.m_type), m_invoke(std::move(old.m_invoke)), m_nfa(std::move(old.m_nfa)), m_literal(std::move(old.m_literal)), m_localid(old.m_localid)
    {
    }